

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void asmjit::v1_14::JitAllocatorImpl_fillPattern(void *mem,uint32_t pattern,size_t byteSize)

{
  ulong in_RDX;
  undefined4 in_ESI;
  undefined2 *in_RDI;
  size_t i;
  size_t n;
  uint32_t *mem32;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  ulong local_30;
  ulong local_18;
  undefined2 *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((((ulong)in_RDI & 1) != 0) && (in_RDX != 0)) {
    *(char *)in_RDI = (char)in_ESI;
    local_8 = (undefined2 *)((long)in_RDI + 1);
    local_18 = in_RDX - 1;
  }
  if ((((ulong)local_8 & 2) != 0) && (1 < local_18)) {
    *local_8 = (short)in_ESI;
    local_8 = local_8 + 1;
    local_18 = local_18 - 2;
  }
  if ((local_18 & 3) != 0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  for (local_30 = 0; local_30 < local_18 >> 2; local_30 = local_30 + 1) {
    *(undefined4 *)(local_8 + local_30 * 2) = in_ESI;
  }
  return;
}

Assistant:

ASMJIT_NOINLINE
ASMJIT_FAVOR_SPEED static void JitAllocatorImpl_fillPattern(void* mem, uint32_t pattern, size_t byteSize) noexcept {
  // NOTE: This is always used to fill a pattern in allocated / freed memory. The allocation has always
  // a granularity that is greater than the pattern, however, when shrink() is used, we may end up having
  // an unaligned start, so deal with it here and then copy aligned pattern in the loop.
  if ((uintptr_t(mem) & 0x1u) && byteSize >= 1u) {
    static_cast<uint8_t*>(mem)[0] = uint8_t(pattern & 0xFF);
    mem = static_cast<uint8_t*>(mem) + 1;
    byteSize--;
  }

  if ((uintptr_t(mem) & 0x2u) && byteSize >= 2u) {
    static_cast<uint16_t*>(mem)[0] = uint16_t(pattern & 0xFFFF);
    mem = static_cast<uint16_t*>(mem) + 1;
    byteSize -= 2;
  }

  // Something would be seriously broken if we end up with aligned `mem`, but unaligned `byteSize`.
  ASMJIT_ASSERT((byteSize & 0x3u) == 0u);

  uint32_t* mem32 = static_cast<uint32_t*>(mem);
  size_t n = byteSize / 4u;

  for (size_t i = 0; i < n; i++)
    mem32[i] = pattern;
}